

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_2d_avx2.c
# Opt level: O1

void av1_highbd_convolve_2d_sr_avx2
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [32];
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  int16_t *piVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  int iVar22;
  long lVar23;
  byte bVar24;
  uint uVar25;
  undefined2 uVar26;
  undefined1 (*pauVar27) [32];
  undefined1 (*pauVar28) [16];
  undefined1 (*pauVar29) [32];
  long lVar30;
  undefined2 uVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  undefined1 (*pauVar35) [32];
  ulong uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  int16_t im_block [1120];
  undefined1 (*local_aa8) [16];
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [2176];
  
  uVar5 = filter_params_x->taps;
  if (uVar5 == 0xc) {
    av1_highbd_convolve_2d_sr_ssse3
              (src,src_stride,dst,dst_stride,w,h,filter_params_x,filter_params_y,subpel_x_qn,
               subpel_y_qn,conv_params,bd);
  }
  else {
    bVar24 = (byte)conv_params->round_0;
    uVar25 = 0xe - (conv_params->round_0 + conv_params->round_1);
    uVar31 = 0xff;
    if (bd == 0xc) {
      uVar31 = 0xfff;
    }
    uVar26 = 0x3ff;
    if (bd != 10) {
      uVar26 = uVar31;
    }
    if (0 < w) {
      iVar21 = ((1 << (bVar24 & 0x1f)) >> 1) + (1 << ((char)bd + 6U & 0x1f));
      iVar34 = ((1 << ((byte)conv_params->round_1 & 0x1f)) >> 1) +
               (-1 << (~bVar24 + (char)bd + 0xe & 0x1f));
      uVar7 = conv_params->round_0;
      uVar8 = conv_params->round_1;
      uVar6 = filter_params_y->taps;
      iVar22 = h + (uint)uVar6 + -1;
      uVar36 = (ulong)((subpel_y_qn & 0xfU) * (uint)uVar6);
      iVar32 = (1 << ((byte)uVar25 & 0x1f)) >> 1;
      auVar39._4_4_ = iVar21;
      auVar39._0_4_ = iVar21;
      auVar39._8_4_ = iVar21;
      auVar39._12_4_ = iVar21;
      auVar39._16_4_ = iVar21;
      auVar39._20_4_ = iVar21;
      auVar39._24_4_ = iVar21;
      auVar39._28_4_ = iVar21;
      piVar9 = filter_params_y->filter_ptr;
      uVar1 = *(undefined4 *)(piVar9 + uVar36 + 6);
      uVar2 = *(undefined4 *)(piVar9 + uVar36 + 4);
      auVar43 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(
                                                  uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
      uVar2 = *(undefined4 *)(piVar9 + uVar36 + 2);
      auVar45 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(
                                                  uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
      uVar2 = *(undefined4 *)(piVar9 + uVar36);
      auVar46._4_4_ = uVar2;
      auVar46._0_4_ = uVar2;
      auVar46._8_4_ = uVar2;
      auVar46._12_4_ = uVar2;
      auVar46._16_4_ = uVar2;
      auVar46._20_4_ = uVar2;
      auVar46._24_4_ = uVar2;
      auVar46._28_4_ = uVar2;
      piVar9 = filter_params_x->filter_ptr;
      uVar36 = (ulong)((subpel_x_qn & 0xfU) * (uint)uVar5);
      uVar2 = *(undefined4 *)(piVar9 + uVar36 + 6);
      auVar47._4_4_ = uVar2;
      auVar47._0_4_ = uVar2;
      auVar47._8_4_ = uVar2;
      auVar47._12_4_ = uVar2;
      auVar47._16_4_ = uVar2;
      auVar47._20_4_ = uVar2;
      auVar47._24_4_ = uVar2;
      auVar47._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(piVar9 + uVar36 + 4);
      auVar48._4_4_ = uVar2;
      auVar48._0_4_ = uVar2;
      auVar48._8_4_ = uVar2;
      auVar48._12_4_ = uVar2;
      auVar48._16_4_ = uVar2;
      auVar48._20_4_ = uVar2;
      auVar48._24_4_ = uVar2;
      auVar48._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(piVar9 + uVar36 + 2);
      uVar3 = *(undefined4 *)(piVar9 + uVar36);
      auVar37._4_4_ = uVar3;
      auVar37._0_4_ = uVar3;
      auVar37._8_4_ = uVar3;
      auVar37._12_4_ = uVar3;
      auVar37._16_4_ = uVar3;
      auVar37._20_4_ = uVar3;
      auVar37._24_4_ = uVar3;
      auVar37._28_4_ = uVar3;
      lVar23 = (long)dst_stride;
      pauVar29 = (undefined1 (*) [32])
                 ((long)src +
                 (2 - ((long)(int)(((uVar6 >> 1) - 1) * src_stride) * 2 + (ulong)(uVar5 >> 1) * 2)))
      ;
      uVar36 = 0;
      local_aa8 = (undefined1 (*) [16])dst;
      do {
        if (0 < iVar22) {
          pauVar27 = (undefined1 (*) [32])local_920;
          lVar33 = 1;
          pauVar35 = pauVar29;
          do {
            auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            if (lVar33 < iVar22) {
              auVar38 = *(undefined1 (*) [32])(*pauVar35 + (long)src_stride * 2);
            }
            auVar4 = *pauVar35;
            auVar41._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar4._0_16_;
            auVar41._16_16_ = ZEXT116(0) * auVar4._16_16_ + ZEXT116(1) * auVar38._0_16_;
            auVar14 = vperm2i128_avx2(auVar4,auVar38,0x31);
            auVar38 = vpalignr_avx2(auVar14,auVar41,4);
            auVar4 = vpalignr_avx2(auVar14,auVar41,8);
            auVar10 = vpalignr_avx2(auVar14,auVar41,0xc);
            auVar11 = vpmaddwd_avx2(auVar37,auVar41);
            auVar13._4_4_ = uVar2;
            auVar13._0_4_ = uVar2;
            auVar13._8_4_ = uVar2;
            auVar13._12_4_ = uVar2;
            auVar13._16_4_ = uVar2;
            auVar13._20_4_ = uVar2;
            auVar13._24_4_ = uVar2;
            auVar13._28_4_ = uVar2;
            auVar12 = vpmaddwd_avx2(auVar13,auVar38);
            auVar38 = vpmaddwd_avx2(auVar48,auVar4);
            auVar4 = vpmaddwd_avx2(auVar47,auVar10);
            auVar38 = vpaddd_avx2(auVar38,auVar4);
            auVar4 = vpaddd_avx2(auVar11,auVar39);
            auVar4 = vpaddd_avx2(auVar4,auVar12);
            auVar38 = vpaddd_avx2(auVar4,auVar38);
            auVar38 = vpsrad_avx2(auVar38,ZEXT416(uVar7));
            auVar38 = vpackssdw_avx2(auVar38,ZEXT432(uVar7));
            auVar4 = vpalignr_avx2(auVar14,auVar41,2);
            auVar10 = vpalignr_avx2(auVar14,auVar41,6);
            auVar11 = vpalignr_avx2(auVar14,auVar41,10);
            auVar12 = vpalignr_avx2(auVar14,auVar41,0xe);
            auVar14 = vpmaddwd_avx2(auVar37,auVar4);
            auVar4 = vpmaddwd_avx2(auVar13,auVar10);
            auVar10 = vpmaddwd_avx2(auVar48,auVar11);
            auVar4 = vpaddd_avx2(auVar4,auVar10);
            auVar11 = vpmaddwd_avx2(auVar47,auVar12);
            auVar10 = vpaddd_avx2(auVar14,auVar39);
            auVar4 = vpaddd_avx2(auVar10,auVar4);
            auVar4 = vpaddd_avx2(auVar4,auVar11);
            auVar4 = vpsrad_avx2(auVar4,ZEXT416(uVar7));
            auVar4 = vpackssdw_avx2(auVar4,ZEXT432(uVar7));
            auVar38 = vpunpcklwd_avx2(auVar38,auVar4);
            *pauVar27 = auVar38;
            pauVar35 = (undefined1 (*) [32])(*pauVar35 + (long)src_stride * 4);
            pauVar27 = pauVar27 + 1;
            lVar30 = lVar33 + 1;
            lVar33 = lVar33 + 2;
          } while (lVar30 < iVar22);
        }
        auVar40 = ZEXT3264(CONCAT428(iVar32,CONCAT424(iVar32,CONCAT420(iVar32,CONCAT416(iVar32,
                                                  CONCAT412(iVar32,CONCAT48(iVar32,CONCAT44(iVar32,
                                                  iVar32))))))));
        if (0 < h) {
          auVar11._16_16_ = auStack_8d0;
          auVar11._0_16_ = local_8e0;
          auVar42._16_16_ = local_8c0;
          auVar42._0_16_ = auStack_8d0;
          auVar10 = vpunpckhwd_avx2(auVar11,auVar42);
          auVar12._16_16_ = auStack_8f0;
          auVar12._0_16_ = local_900;
          auVar20._16_16_ = local_8e0;
          auVar20._0_16_ = auStack_8f0;
          auVar38 = vpunpckhwd_avx2(auVar12,auVar20);
          auVar14._16_16_ = auStack_910;
          auVar14._0_16_ = local_920;
          auVar19._16_16_ = local_900;
          auVar19._0_16_ = auStack_910;
          auVar4 = vpunpckhwd_avx2(auVar14,auVar19);
          auVar11 = vpunpcklwd_avx2(auVar11,auVar42);
          auVar12 = vpunpcklwd_avx2(auVar12,auVar20);
          auVar14 = vpunpcklwd_avx2(auVar14,auVar19);
          pauVar27 = (undefined1 (*) [32])auStack_8b0;
          lVar33 = 0;
          pauVar28 = local_aa8;
          do {
            auVar19 = auVar11;
            auVar20 = auVar38;
            auVar11 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar27[-1] + 0x10),*pauVar27);
            auVar41 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar27[-1] + 0x10),*pauVar27);
            auVar44 = auVar45._0_32_;
            auVar38 = vpmaddwd_avx2(auVar44,auVar12);
            auVar42 = auVar43._0_32_;
            auVar13 = vpmaddwd_avx2(auVar42,auVar19);
            auVar38 = vpaddd_avx2(auVar38,auVar13);
            auVar14 = vpmaddwd_avx2(auVar46,auVar14);
            auVar18._4_4_ = iVar34;
            auVar18._0_4_ = iVar34;
            auVar18._8_4_ = iVar34;
            auVar18._12_4_ = iVar34;
            auVar18._16_4_ = iVar34;
            auVar18._20_4_ = iVar34;
            auVar18._24_4_ = iVar34;
            auVar18._28_4_ = iVar34;
            auVar14 = vpaddd_avx2(auVar18,auVar14);
            auVar38 = vpaddd_avx2(auVar38,auVar14);
            auVar17._4_4_ = uVar1;
            auVar17._0_4_ = uVar1;
            auVar17._8_4_ = uVar1;
            auVar17._12_4_ = uVar1;
            auVar17._16_4_ = uVar1;
            auVar17._20_4_ = uVar1;
            auVar17._24_4_ = uVar1;
            auVar17._28_4_ = uVar1;
            auVar14 = vpmaddwd_avx2(auVar17,auVar11);
            auVar38 = vpaddd_avx2(auVar14,auVar38);
            auVar38 = vpsrad_avx2(auVar38,ZEXT416(uVar8));
            auVar38 = vpaddd_avx2(auVar38,auVar40._0_32_);
            auVar38 = vpsrad_avx2(auVar38,ZEXT416(uVar25));
            if ((long)uVar36 < (long)((ulong)(uint)w - 4)) {
              auVar14 = vpmaddwd_avx2(auVar44,auVar20);
              auVar13 = vpmaddwd_avx2(auVar42,auVar10);
              auVar14 = vpaddd_avx2(auVar14,auVar13);
              auVar4 = vpmaddwd_avx2(auVar4,auVar46);
              auVar4 = vpaddd_avx2(auVar4,auVar18);
              auVar15._4_4_ = iVar32;
              auVar15._0_4_ = iVar32;
              auVar15._8_4_ = iVar32;
              auVar15._12_4_ = iVar32;
              auVar15._16_4_ = iVar32;
              auVar15._20_4_ = iVar32;
              auVar15._24_4_ = iVar32;
              auVar15._28_4_ = iVar32;
              auVar40 = ZEXT3264(auVar15);
              auVar4 = vpaddd_avx2(auVar4,auVar14);
              auVar14 = vpmaddwd_avx2(auVar41,auVar17);
              auVar4 = vpaddd_avx2(auVar4,auVar14);
              auVar4 = vpsrad_avx2(auVar4,ZEXT416(uVar8));
              auVar4 = vpaddd_avx2(auVar4,auVar15);
              auVar4 = vpsrad_avx2(auVar4,ZEXT416(uVar25));
              auVar38 = vpackssdw_avx2(auVar38,auVar4);
              auVar16._2_2_ = uVar26;
              auVar16._0_2_ = uVar26;
              auVar16._4_2_ = uVar26;
              auVar16._6_2_ = uVar26;
              auVar16._8_2_ = uVar26;
              auVar16._10_2_ = uVar26;
              auVar16._12_2_ = uVar26;
              auVar16._14_2_ = uVar26;
              auVar16._16_2_ = uVar26;
              auVar16._18_2_ = uVar26;
              auVar16._20_2_ = uVar26;
              auVar16._22_2_ = uVar26;
              auVar16._24_2_ = uVar26;
              auVar16._26_2_ = uVar26;
              auVar16._28_2_ = uVar26;
              auVar16._30_2_ = uVar26;
              auVar38 = vpminsw_avx2(auVar38,auVar16);
              auVar38 = vpmaxsw_avx2(auVar38,_DAT_005173a0);
              *pauVar28 = auVar38._0_16_;
              *(undefined1 (*) [16])((long)*pauVar28 + lVar23 * 2) = auVar38._16_16_;
            }
            else {
              auVar38 = vpackssdw_avx2(auVar38,auVar38);
              auVar4._2_2_ = uVar26;
              auVar4._0_2_ = uVar26;
              auVar4._4_2_ = uVar26;
              auVar4._6_2_ = uVar26;
              auVar4._8_2_ = uVar26;
              auVar4._10_2_ = uVar26;
              auVar4._12_2_ = uVar26;
              auVar4._14_2_ = uVar26;
              auVar4._16_2_ = uVar26;
              auVar4._18_2_ = uVar26;
              auVar4._20_2_ = uVar26;
              auVar4._22_2_ = uVar26;
              auVar4._24_2_ = uVar26;
              auVar4._26_2_ = uVar26;
              auVar4._28_2_ = uVar26;
              auVar4._30_2_ = uVar26;
              auVar38 = vpminsw_avx2(auVar38,auVar4);
              auVar38 = vpmaxsw_avx2(auVar38,_DAT_005173a0);
              if (w == 4) {
                *(long *)*pauVar28 = auVar38._0_8_;
                *(long *)((long)*pauVar28 + lVar23 * 2) = auVar38._16_8_;
              }
              else {
                *(int *)*pauVar28 = auVar38._0_4_;
                *(int *)((long)*pauVar28 + lVar23 * 2) = auVar38._16_4_;
              }
            }
            auVar43 = ZEXT3264(auVar42);
            auVar45 = ZEXT3264(auVar44);
            lVar33 = lVar33 + 2;
            pauVar28 = (undefined1 (*) [16])((long)*pauVar28 + lVar23 * 2 * 2);
            pauVar27 = pauVar27 + 1;
            auVar14 = auVar12;
            auVar38 = auVar10;
            auVar10 = auVar41;
            auVar4 = auVar20;
            auVar12 = auVar19;
          } while (lVar33 < h);
        }
        uVar36 = uVar36 + 8;
        pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
        local_aa8 = local_aa8 + 1;
      } while (uVar36 < (uint)w);
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_sr_avx2(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_x,
                                    const InterpFilterParams *filter_params_y,
                                    const int subpel_x_qn,
                                    const int subpel_y_qn,
                                    ConvolveParams *conv_params, int bd) {
  if (filter_params_x->taps == 12) {
    av1_highbd_convolve_2d_sr_ssse3(src, src_stride, dst, dst_stride, w, h,
                                    filter_params_x, filter_params_y,
                                    subpel_x_qn, subpel_y_qn, conv_params, bd);
    return;
  }

  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = 8;
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  __m256i s[8], coeffs_y[4], coeffs_x[4];

  const __m256i round_const_x = _mm256_set1_epi32(
      ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const __m256i round_const_y = _mm256_set1_epi32(
      ((1 << conv_params->round_1) >> 1) -
      (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);

  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);
  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    {
      for (i = 0; i < im_h; i += 2) {
        const __m256i row0 =
            _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
        __m256i row1 = _mm256_setzero_si256();
        if (i + 1 < im_h)
          row1 =
              _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

        const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
        const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

        // even pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 0);
        s[1] = _mm256_alignr_epi8(r1, r0, 4);
        s[2] = _mm256_alignr_epi8(r1, r0, 8);
        s[3] = _mm256_alignr_epi8(r1, r0, 12);

        __m256i res_even = convolve(s, coeffs_x);
        res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                    round_shift_x);

        // odd pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 2);
        s[1] = _mm256_alignr_epi8(r1, r0, 6);
        s[2] = _mm256_alignr_epi8(r1, r0, 10);
        s[3] = _mm256_alignr_epi8(r1, r0, 14);

        __m256i res_odd = convolve(s, coeffs_x);
        res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                   round_shift_x);

        __m256i res_even1 = _mm256_packs_epi32(res_even, res_even);
        __m256i res_odd1 = _mm256_packs_epi32(res_odd, res_odd);
        __m256i res = _mm256_unpacklo_epi16(res_even1, res_odd1);

        _mm256_store_si256((__m256i *)&im_block[i * im_stride], res);
      }
    }

    /* Vertical filter */
    {
      __m256i s0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i s1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i s2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i s3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));
      __m256i s4 = _mm256_loadu_si256((__m256i *)(im_block + 4 * im_stride));
      __m256i s5 = _mm256_loadu_si256((__m256i *)(im_block + 5 * im_stride));

      s[0] = _mm256_unpacklo_epi16(s0, s1);
      s[1] = _mm256_unpacklo_epi16(s2, s3);
      s[2] = _mm256_unpacklo_epi16(s4, s5);

      s[4] = _mm256_unpackhi_epi16(s0, s1);
      s[5] = _mm256_unpackhi_epi16(s2, s3);
      s[6] = _mm256_unpackhi_epi16(s4, s5);

      for (i = 0; i < h; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s6 =
            _mm256_loadu_si256((__m256i *)(data + 6 * im_stride));
        const __m256i s7 =
            _mm256_loadu_si256((__m256i *)(data + 7 * im_stride));

        s[3] = _mm256_unpacklo_epi16(s6, s7);
        s[7] = _mm256_unpackhi_epi16(s6, s7);

        const __m256i res_a = convolve(s, coeffs_y);
        __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_y), round_shift_y);

        res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a_round, round_const_bits), round_shift_bits);

        if (w - j > 4) {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_y), round_shift_y);
          res_b_round =
              _mm256_sra_epi32(_mm256_add_epi32(res_b_round, round_const_bits),
                               round_shift_bits);

          __m256i res_16bit = _mm256_packs_epi32(res_a_round, res_b_round);
          res_16bit = _mm256_min_epi16(res_16bit, clip_pixel);
          res_16bit = _mm256_max_epi16(res_16bit, zero);

          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_16bit));
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_16bit, 1));
        } else if (w == 4) {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_a_round));
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_a_round, 1));
        } else {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          xx_storel_32(&dst[i * dst_stride + j],
                       _mm256_castsi256_si128(res_a_round));
          xx_storel_32(&dst[i * dst_stride + j + dst_stride],
                       _mm256_extracti128_si256(res_a_round, 1));
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}